

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

Symbol * __thiscall hdc::SymbolTable::add(SymbolTable *this,GlobalVariable *var)

{
  Symbol *this_00;
  mapped_type *ppSVar1;
  undefined1 local_50 [56];
  Symbol *symbol;
  GlobalVariable *var_local;
  SymbolTable *this_local;
  
  symbol = (Symbol *)var;
  var_local = (GlobalVariable *)this;
  this_00 = (Symbol *)operator_new(0x38);
  Symbol::Symbol(this_00,(GlobalVariable *)symbol);
  local_50._48_8_ = this_00;
  Variable::getName_abi_cxx11_((Variable *)local_50);
  ppSVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::Symbol_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hdc::Symbol_*>_>_>
            ::operator[](&this->symbols,(key_type *)local_50);
  *ppSVar1 = this_00;
  std::__cxx11::string::~string((string *)local_50);
  return (Symbol *)local_50._48_8_;
}

Assistant:

Symbol*SymbolTable::add(GlobalVariable* var) {
    Symbol* symbol = new Symbol(var);
    symbols[var->getName()] = symbol;
    return symbol;
}